

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDP_Solver.cpp
# Opt level: O0

double runOneSimulation(QTable *q,PlanningUnitDecPOMDPDiscrete *np,SimulationDecPOMDPDiscrete *sim)

{
  ulong uVar1;
  ulong uVar2;
  AgentMDP *this;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *pvVar3;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *this_00;
  reference ppAVar4;
  PlanningUnitDecPOMDPDiscrete *in_RSI;
  QTable *in_RDI;
  double dVar5;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *in_stack_00000038;
  SimulationDecPOMDPDiscrete *in_stack_00000040;
  Index i_1;
  double avgReward;
  SimulationResult result;
  Index i;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  AgentFullyObservable *newAgent;
  AgentMDP agent;
  value_type *in_stack_fffffffffffffee8;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *in_stack_fffffffffffffef0
  ;
  uint local_e4;
  SimulationResult local_d8 [68];
  uint local_94;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> local_90;
  AgentMDP *local_78;
  AgentMDP local_70 [96];
  PlanningUnitDecPOMDPDiscrete *local_10;
  
  local_10 = in_RSI;
  AgentMDP::AgentMDP(local_70,in_RSI,0,in_RDI);
  std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::vector
            ((vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)0x10725b);
  local_94 = 0;
  while( true ) {
    uVar1 = (ulong)local_94;
    uVar2 = (**(code **)(*(long *)local_10 + 0x30))();
    if (uVar2 <= uVar1) break;
    this = (AgentMDP *)operator_new(0x58);
    AgentMDP::AgentMDP(this,local_70);
    local_78 = this;
    (**(code **)(*(long *)(this + *(long *)(*(long *)this + -0x18)) + 0x18))
              (this + *(long *)(*(long *)this + -0x18),local_94);
    std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::push_back
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_94 = local_94 + 1;
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            (in_stack_00000040,in_stack_00000038);
  dVar5 = SimulationResult::GetAvgReward(local_d8);
  local_e4 = 0;
  while( true ) {
    pvVar3 = (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)
             (ulong)local_e4;
    this_00 = (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)
              (**(code **)(*(long *)local_10 + 0x30))();
    if (this_00 <= pvVar3) break;
    ppAVar4 = std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::
              operator[](&local_90,(ulong)local_e4);
    if (*ppAVar4 != (value_type)0x0) {
      (**(code **)(*(long *)*ppAVar4 + 8))();
    }
    local_e4 = local_e4 + 1;
  }
  SimulationResult::~SimulationResult(local_d8);
  std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::~vector(this_00);
  AgentMDP::~AgentMDP(local_70);
  return dVar5;
}

Assistant:

double runOneSimulation(  const QTable & q,
                          const PlanningUnitDecPOMDPDiscrete *np,
                          const SimulationDecPOMDPDiscrete &sim
                          )
{
    AgentMDP agent(np, 0, q);
    AgentFullyObservable *newAgent;
    vector<AgentFullyObservable*> agents;

    for(Index i=0; i < np->GetNrAgents(); i++)
    {
        newAgent=new AgentMDP(agent);
        newAgent->SetIndex(i);
        agents.push_back(newAgent);
    }
    SimulationResult result=sim.RunSimulations(agents);
    double avgReward=result.GetAvgReward();

    for(Index i=0; i < np->GetNrAgents(); i++)
        delete agents[i];

    return(avgReward);
}